

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Type TVar7;
  TestEventListeners *this_00;
  TestEventListener *pTVar8;
  TimeInMillis TVar9;
  Random *this_01;
  UnitTestImpl *this_02;
  TestPartResult *this_03;
  undefined8 uVar10;
  UnitTestImpl *in_RDI;
  int test_index_1;
  int j_1;
  int test_index;
  string *result;
  TestPartResult *test_part_result;
  int j;
  TestResult *test_result;
  Timer timer;
  char *in_stack_000000b8;
  int i;
  bool recreate_environments_when_repeating;
  bool gtest_repeat_forever;
  int repeat;
  TestEventListener *repeater;
  bool failed;
  bool has_tests_to_run;
  bool should_shard;
  bool in_subprocess_for_death_test;
  bool gtest_is_initialized_before_run_all_tests;
  ReactionToSharding in_stack_0000013c;
  UnitTestImpl *in_stack_00000140;
  UnitTestImpl *in_stack_00000280;
  nullptr_t in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  UnitTestImpl *in_stack_ffffffffffffff30;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
  *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined2 in_stack_ffffffffffffff48;
  undefined1 uVar11;
  bool bVar12;
  undefined1 uVar13;
  uint uVar14;
  uint uVar15;
  int in_stack_ffffffffffffff64;
  int local_98;
  int local_94;
  int local_90;
  undefined8 local_79;
  TestSuite *in_stack_ffffffffffffff90;
  int local_44;
  uint local_2c;
  
  bVar2 = GTestIsInitialized();
  if ((g_help_flag & 1) == 0) {
    PostFlagParsingInit(in_stack_ffffffffffffff30);
    WriteToShardStatusFileIfNeeded();
    bVar3 = std::operator!=((unique_ptr<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
                             *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                            in_stack_ffffffffffffff18);
    ShouldShard(in_stack_000000b8,(char *)timer.start_.__d.__r,test_result._7_1_);
    iVar5 = FilterTests(in_stack_00000140,in_stack_0000013c);
    if ((FLAGS_gtest_list_tests & 1) == 0) {
      iVar6 = GetRandomSeedFromFlag(in_stack_ffffffffffffff24);
      in_RDI->random_seed_ = iVar6;
      bVar1 = 0;
      this_00 = listeners(in_RDI);
      pTVar8 = TestEventListeners::repeater(this_00);
      TVar9 = GetTimeInMillis();
      in_RDI->start_timestamp_ = TVar9;
      (*pTVar8->_vptr_TestEventListener[2])(pTVar8,in_RDI->parent_);
      uVar14 = FLAGS_gtest_repeat;
      if (bVar3) {
        uVar14 = 1;
      }
      bVar3 = (int)uVar14 < 0;
      bVar12 = (FLAGS_gtest_recreate_environments_when_repeating & 1) != 0 || bVar3;
      local_2c = 0;
      uVar13 = bVar12;
      uVar15 = uVar14;
LAB_00148213:
      uVar11 = bVar3 || local_2c != uVar14;
      if (bVar3 || local_2c != uVar14) {
        ClearNonAdHocTestResult((UnitTestImpl *)0x14824f);
        Timer::Timer((Timer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        if ((0 < iVar5) && ((FLAGS_gtest_shuffle & 1) != 0)) {
          this_01 = (Random *)random(in_RDI);
          Random::Reseed(this_01,in_RDI->random_seed_);
          ShuffleTests(in_RDI);
        }
        (*pTVar8->_vptr_TestEventListener[3])(pTVar8,in_RDI->parent_,(ulong)local_2c);
        if (0 < iVar5) {
          if ((local_2c == 0) || (bVar12)) {
            (*pTVar8->_vptr_TestEventListener[4])(pTVar8,in_RDI->parent_);
            ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                      ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
                       in_stack_ffffffffffffff30,
                       (_func_void_Environment_ptr *)
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
            (*pTVar8->_vptr_TestEventListener[5])(pTVar8,in_RDI->parent_);
          }
          bVar4 = Test::IsSkipped();
          if (bVar4) {
            this_02 = GetUnitTestImpl();
            current_test_result(this_02);
            local_44 = 0;
            while (in_stack_ffffffffffffff44 = local_44,
                  iVar6 = TestResult::total_part_count((TestResult *)0x148362),
                  in_stack_ffffffffffffff44 < iVar6) {
              this_03 = TestResult::GetTestPartResult
                                  ((TestResult *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c
                                  );
              TVar7 = TestPartResult::type(this_03);
              if (TVar7 == kSkip) {
                in_stack_ffffffffffffff30 =
                     (UnitTestImpl *)TestPartResult::message((TestPartResult *)0x1483af);
                in_stack_ffffffffffffff38 =
                     (reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
                      *)&local_79;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_RDI,(char *)CONCAT44(uVar15,CONCAT13(uVar13,CONCAT12(uVar11,
                                                  in_stack_ffffffffffffff48))),
                           (allocator<char> *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
                std::allocator<char>::~allocator((allocator<char> *)&local_79);
                uVar10 = std::__cxx11::string::c_str();
                printf("%s\n",uVar10);
                std::__cxx11::string::~string((string *)((long)&local_79 + 1));
              }
              local_44 = local_44 + 1;
            }
            fflush(_stdout);
          }
          else {
            bVar4 = Test::HasFatalFailure();
            if (bVar4) {
              bVar4 = Test::HasFatalFailure();
              if (bVar4) {
                local_98 = 0;
                while (in_stack_ffffffffffffff24 = local_98,
                      iVar6 = total_test_suite_count((UnitTestImpl *)0x148577),
                      in_stack_ffffffffffffff24 < iVar6) {
                  GetMutableSuiteCase(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
                  TestSuite::Skip((TestSuite *)
                                  CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
                  local_98 = local_98 + 1;
                }
              }
            }
            else {
              local_90 = 0;
              while (in_stack_ffffffffffffff2c = local_90,
                    iVar6 = total_test_suite_count((UnitTestImpl *)0x1484a9),
                    in_stack_ffffffffffffff2c < iVar6) {
                GetMutableSuiteCase(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
                TestSuite::Run(in_stack_ffffffffffffff90);
                if ((FLAGS_gtest_fail_fast & 1) != 0) {
                  GetMutableSuiteCase(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
                  bVar4 = TestSuite::Failed((TestSuite *)
                                            CONCAT44(in_stack_ffffffffffffff24,
                                                     in_stack_ffffffffffffff20));
                  local_94 = local_90;
                  if (bVar4) goto LAB_001484fd;
                }
                local_90 = local_90 + 1;
              }
            }
          }
          goto LAB_001485aa;
        }
        goto LAB_0014863b;
      }
      (*pTVar8->_vptr_TestEventListener[0x11])(pTVar8,in_RDI->parent_);
      if (!bVar2) {
        ColoredPrintf(kRed,
                      "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                     );
      }
      bVar2 = (bool)(bVar1 ^ 1);
    }
    else {
      ListTestsMatchingFilter(in_stack_00000280);
      bVar2 = true;
    }
  }
  else {
    bVar2 = true;
  }
  return bVar2;
LAB_001484fd:
  while( true ) {
    local_94 = local_94 + 1;
    in_stack_ffffffffffffff28 = local_94;
    iVar6 = total_test_suite_count((UnitTestImpl *)0x14850f);
    if (iVar6 <= in_stack_ffffffffffffff28) break;
    GetMutableSuiteCase(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    TestSuite::Skip((TestSuite *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
LAB_001485aa:
  if ((local_2c == uVar14 - 1) || (bVar12)) {
    (*pTVar8->_vptr_TestEventListener[0xe])(pTVar8,in_RDI->parent_);
    std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rbegin
              ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rend
              ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    __std__for_each<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>,void(*)(testing::Environment*)>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_void____testing__Environment____
              ((reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38,(_func_void_Environment_ptr *)in_stack_ffffffffffffff30);
    (*pTVar8->_vptr_TestEventListener[0xf])(pTVar8,in_RDI->parent_);
  }
LAB_0014863b:
  TVar9 = Timer::Elapsed((Timer *)in_stack_ffffffffffffff30);
  in_RDI->elapsed_time_ = TVar9;
  (*pTVar8->_vptr_TestEventListener[0x10])(pTVar8,in_RDI->parent_,(ulong)local_2c);
  bVar4 = Passed((UnitTestImpl *)0x14867d);
  if (!bVar4) {
    bVar1 = 1;
  }
  UnshuffleTests(in_stack_ffffffffffffff30);
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    iVar6 = GetNextRandomSeed(in_stack_ffffffffffffff64);
    in_RDI->random_seed_ = iVar6;
  }
  local_2c = local_2c + 1;
  goto LAB_00148213;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True if and only if Google Test is initialized before RUN_ALL_TESTS() is
  // called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag) return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

#if GTEST_HAS_FILE_SYSTEM
  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();
#endif  // GTEST_HAS_FILE_SYSTEM

  // True if and only if we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#ifdef GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test = (internal_run_death_test_flag_ != nullptr);
#if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
#endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run =
      FilterTests(should_shard ? HONOR_SHARDING_PROTOCOL
                               : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG_GET(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GetRandomSeedFromFlag(GTEST_FLAG_GET(random_seed));

  // True if and only if at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG_GET(repeat);

  // Repeats forever if the repeat count is negative.
  const bool gtest_repeat_forever = repeat < 0;

  // Should test environments be set up and torn down for each repeat, or only
  // set up on the first and torn down on the last iteration? If there is no
  // "last" iteration because the tests will repeat forever, always recreate the
  // environments to avoid leaks in case one of the environments is using
  // resources that are external to this process. Without this check there would
  // be no way to clean up those external resources automatically.
  const bool recreate_environments_when_repeating =
      GTEST_FLAG_GET(recreate_environments_when_repeating) ||
      gtest_repeat_forever;

  for (int i = 0; gtest_repeat_forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    Timer timer;

    // Shuffles test suites and tests if requested.
    if (has_tests_to_run && GTEST_FLAG_GET(shuffle)) {
      random()->Reseed(static_cast<uint32_t>(random_seed_));
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test suite if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand. If test environments aren't
      // recreated for each iteration, only do so on the first iteration.
      if (i == 0 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsSetUpStart(*parent_);
        ForEach(environments_, SetUpEnvironment);
        repeater->OnEnvironmentsSetUpEnd(*parent_);
      }

      // Runs the tests only if there was no fatal failure or skip triggered
      // during global set-up.
      if (Test::IsSkipped()) {
        // Emit diagnostics when global set-up calls skip, as it will not be
        // emitted by default.
        TestResult& test_result =
            *internal::GetUnitTestImpl()->current_test_result();
        for (int j = 0; j < test_result.total_part_count(); ++j) {
          const TestPartResult& test_part_result =
              test_result.GetTestPartResult(j);
          if (test_part_result.type() == TestPartResult::kSkip) {
            const std::string& result = test_part_result.message();
            printf("%s\n", result.c_str());
          }
        }
        fflush(stdout);
      } else if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Run();
          if (GTEST_FLAG_GET(fail_fast) &&
              GetMutableSuiteCase(test_index)->Failed()) {
            for (int j = test_index + 1; j < total_test_suite_count(); j++) {
              GetMutableSuiteCase(j)->Skip();
            }
            break;
          }
        }
      } else if (Test::HasFatalFailure()) {
        // If there was a fatal failure during the global setup then we know we
        // aren't going to run any tests. Explicitly mark all of the tests as
        // skipped to make this obvious in the output.
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Skip();
        }
      }

      // Tears down all environments in reverse order afterwards. If test
      // environments aren't recreated for each iteration, only do so on the
      // last iteration.
      if (i == repeat - 1 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsTearDownStart(*parent_);
        std::for_each(environments_.rbegin(), environments_.rend(),
                      TearDownEnvironment);
        repeater->OnEnvironmentsTearDownEnd(*parent_);
      }
    }

    elapsed_time_ = timer.Elapsed();

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG_GET(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        GTestColor::kRed,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
  }

  return !failed;
}